

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cxx
# Opt level: O3

void __thiscall SSD1306::FileDescriptor::~FileDescriptor(FileDescriptor *this)

{
  CloseIfFunction *pCVar1;
  _Manager_type p_Var2;
  bool bVar3;
  undefined8 uVar4;
  int local_14;
  
  if ((this->close_if_).super__Function_base._M_manager != (_Manager_type)0x0) {
    pCVar1 = &this->close_if_;
    bVar3 = (*(this->close_if_)._M_invoker)((_Any_data *)pCVar1,&local_14);
    if (bVar3) {
      close(this->fd_);
    }
    p_Var2 = (this->close_if_).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
    }
    return;
  }
  uVar4 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar4);
}

Assistant:

SSD1306::FileDescriptor::~FileDescriptor()
{
    if (close_if_(fd_))
    {
        ::close(fd_);
    }
}